

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O1

void __thiscall
MeshDenoisingBase::getFaceArea
          (MeshDenoisingBase *this,TriMesh *mesh,vector<double,_std::allocator<double>_> *area)

{
  double *pdVar1;
  value_type _idx;
  size_type __new_size;
  Face *pFVar2;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  FaceIter FVar12;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  local_98;
  vector<double,_std::allocator<double>_> *local_80;
  undefined1 auStack_78 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> point;
  undefined1 local_58 [8];
  FaceVertexIter fv_it;
  FaceIter f_it;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  local_80 = area;
  std::vector<double,_std::allocator<double>_>::resize(area,__new_size);
  join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  FVar12 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
  if (((mesh_ptr)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ !=
       FVar12.mesh_) || (f_it.mesh_._0_4_ != (BaseHandle)FVar12.hnd_.super_BaseHandle.idx_)) {
    do {
      auStack_78 = (undefined1  [8])0x0;
      point.
      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      point.
      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
      resize((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *
             )auStack_78,3);
      pFVar2 = OpenMesh::ArrayKernel::face((ArrayKernel *)mesh,(FaceHandle)f_it.mesh_._0_4_);
      fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
           (pFVar2->halfedge_handle_).super_BaseHandle.idx_;
      fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
           (BaseHandle)0x0;
      fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
           (BaseHandle)0xffffffff;
      local_58 = (undefined1  [8])mesh;
      fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
           (int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
      if ((int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ != -1) {
        lVar4 = 0;
        do {
          if (((int)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
               fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
             (fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle
              .idx_ != 0)) break;
          _idx = OpenMesh::Iterators::
                 GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                 ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                              *)local_58);
          this_00 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)
                               &(mesh->super_Mesh).
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                .field_0x8,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               (mesh->super_Mesh).
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                               super_BaseHandle.idx_);
          pvVar3 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                             (this_00,(int)_idx.super_BaseHandle.idx_);
          dVar6 = (pvVar3->super_VectorDataT<double,_3>).values_[1];
          pdVar1 = (double *)((long)((VectorDataT<double,_3> *)auStack_78)->values_ + lVar4);
          *pdVar1 = (pvVar3->super_VectorDataT<double,_3>).values_[0];
          pdVar1[1] = dVar6;
          *(double *)((long)((VectorDataT<double,_3> *)auStack_78)->values_ + lVar4 + 0x10) =
               (pvVar3->super_VectorDataT<double,_3>).values_[2];
          OpenMesh::Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_98,
                       (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                        *)local_58,0);
          lVar4 = lVar4 + 0x18;
        } while (fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
      }
      dVar6 = (((pointer)((long)auStack_78 + 0x18))->super_VectorDataT<double,_3>).values_[0];
      dVar8 = dVar6 - ((VectorDataT<double,_3> *)auStack_78)->values_[0];
      dVar5 = (((pointer)((long)auStack_78 + 0x18))->super_VectorDataT<double,_3>).values_[1];
      dVar9 = dVar5 - ((VectorDataT<double,_3> *)auStack_78)->values_[1];
      dVar11 = (((pointer)((long)auStack_78 + 0x18))->super_VectorDataT<double,_3>).values_[2];
      dVar7 = dVar11 - ((VectorDataT<double,_3> *)auStack_78)->values_[2];
      dVar6 = dVar6 - (((pointer)((long)auStack_78 + 0x30))->super_VectorDataT<double,_3>).values_
                      [0];
      dVar5 = dVar5 - (((pointer)((long)auStack_78 + 0x30))->super_VectorDataT<double,_3>).values_
                      [1];
      dVar11 = dVar11 - (((pointer)((long)auStack_78 + 0x30))->super_VectorDataT<double,_3>).values_
                        [2];
      dVar10 = dVar9 * dVar11 - dVar5 * dVar7;
      dVar11 = dVar7 * dVar6 - dVar11 * dVar8;
      dVar6 = dVar5 * dVar8 - dVar6 * dVar9;
      dVar6 = dVar6 * dVar6 + dVar10 * dVar10 + dVar11 * dVar11;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      (local_80->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[(int)f_it.mesh_._0_4_] = dVar6 * 0.5;
      if (auStack_78 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_78);
      }
      f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it.mesh_._0_4_ + 1);
      if (f_it.mesh_._4_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)&fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
      }
      FVar12 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    } while (((mesh_ptr)fv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ !=
              FVar12.mesh_) || (f_it.mesh_._0_4_ != (BaseHandle)FVar12.hnd_.super_BaseHandle.idx_));
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceArea(TriMesh &mesh, std::vector<double> &area)
{
    area.resize(mesh.n_faces());

    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        std::vector<TriMesh::Point> point;
        point.resize(3); int index = 0;
        for(TriMesh::FaceVertexIter fv_it = mesh.fv_iter(*f_it); fv_it.is_valid(); fv_it++)
        {
            point[index] = mesh.point(*fv_it);
            index++;
        }
        TriMesh::Point edge1 = point[1] - point[0];
        TriMesh::Point edge2 = point[1] - point[2];
        double S = 0.5 * (edge1 % edge2).length();
        area[(*f_it).idx()] = S;
    }
}